

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpgen.cpp
# Opt level: O0

void __thiscall
cp::cpgen::calcNextFootprint
          (cpgen *this,Vector3 *step_vector,double step_angle,Pose *ref_waist_pose,
          Pose *ref_land_pose)

{
  QuaternionBase<Eigen::Quaternion<double,0>> *pQVar1;
  MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *pMVar2;
  Scalar *pSVar3;
  RotationBase<Eigen::Quaternion<double,0>,3> *this_00;
  QuaternionBase<Eigen::Quaternion<double,_0>_> *other;
  undefined1 local_128 [8];
  Quat ref_land_pose_q;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_f0;
  undefined1 local_d8 [8];
  Vector3 ref_land_pose_p;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_a8;
  undefined1 local_90 [8];
  Vector3 waist_pos;
  undefined1 local_58 [8];
  Quat waist_r;
  Pose *ref_land_pose_local;
  Pose *ref_waist_pose_local;
  double step_angle_local;
  Vector3 *step_vector_local;
  cpgen *this_local;
  
  pQVar1 = (QuaternionBase<Eigen::Quaternion<double,0>> *)Pose::q(ref_waist_pose);
  rpy2q((Quat *)(waist_pos.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array + 2),0.0,0.0,step_angle);
  Eigen::QuaternionBase<Eigen::Quaternion<double,0>>::operator*
            ((Quaternion<double,_0> *)local_58,pQVar1,
             (QuaternionBase<Eigen::Quaternion<double,_0>_> *)
             (waist_pos.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array + 2));
  pMVar2 = (MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)Pose::p(ref_waist_pose);
  Eigen::RotationBase<Eigen::Quaternion<double,0>,3>::operator*
            ((ReturnType *)
             (ref_land_pose_p.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
              .m_data.array + 2),(RotationBase<Eigen::Quaternion<double,0>,3> *)local_58,
             (EigenBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)step_vector);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+
            (&local_a8,pMVar2,
             (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             (ref_land_pose_p.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
              .m_data.array + 2));
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((Matrix<double,3,1,0,3,1> *)local_90,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&local_a8);
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::z
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)local_90);
  *pSVar3 = 0.0;
  Pose::set(ref_waist_pose,(Vector3 *)local_90,(Quat *)local_58);
  pMVar2 = (MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)Pose::p(ref_waist_pose);
  this_00 = (RotationBase<Eigen::Quaternion<double,0>,3> *)Pose::q(ref_waist_pose);
  Eigen::RotationBase<Eigen::Quaternion<double,0>,3>::operator*
            ((ReturnType *)
             (ref_land_pose_q.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
              m_storage.m_data.array + 3),this_00,
             (EigenBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             (this + (ulong)*(uint *)(this + 0x8d8) * 0x18 + 0x8f0));
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+
            (&local_f0,pMVar2,
             (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             (ref_land_pose_q.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
              m_storage.m_data.array + 3));
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((Matrix<double,3,1,0,3,1> *)local_d8,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&local_f0);
  pQVar1 = (QuaternionBase<Eigen::Quaternion<double,0>> *)Pose::q(ref_waist_pose);
  other = (QuaternionBase<Eigen::Quaternion<double,_0>_> *)Pose::q((Pose *)(this + 0x920));
  Eigen::QuaternionBase<Eigen::Quaternion<double,0>>::operator*
            ((Quaternion<double,_0> *)local_128,pQVar1,other);
  Pose::set(ref_land_pose + *(uint *)(this + 0x8d8),(Vector3 *)local_d8,(Quat *)local_128);
  return;
}

Assistant:

void cpgen::calcNextFootprint(const Vector3& step_vector, double step_angle,
    Pose& ref_waist_pose, Pose ref_land_pose[]) {

  // calc next waist pose
  Quat waist_r = ref_waist_pose.q() * rpy2q(0.0, 0.0, step_angle);
  Vector3 waist_pos = ref_waist_pose.p() + waist_r * step_vector;
  waist_pos.z() = 0.0;
  ref_waist_pose.set(waist_pos, waist_r);

  // calc footprints
  Vector3 ref_land_pose_p = ref_waist_pose.p() +
                            ref_waist_pose.q() * dist_body2foot[swingleg];
  Quat ref_land_pose_q    = ref_waist_pose.q() * init_feet_pose[0].q();
  ref_land_pose[swingleg].set(ref_land_pose_p, ref_land_pose_q);
}